

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord_rep_flat.h
# Opt level: O2

CordRepFlat * absl::lts_20250127::cord_internal::CordRepFlat::NewImpl<4096ul>(size_t len)

{
  uint8_t uVar1;
  size_t sVar2;
  CordRepFlat *pCVar3;
  size_t size;
  
  sVar2 = 0xff3;
  if (len < 0xff3) {
    sVar2 = len;
  }
  size = 0x20;
  if (0x13 < len) {
    size = sVar2 + 0xd;
  }
  sVar2 = RoundUpForTag(size);
  pCVar3 = (CordRepFlat *)operator_new(sVar2);
  (pCVar3->super_CordRep).length = 0;
  (pCVar3->super_CordRep).refcount = (atomic<int>)0x0;
  (pCVar3->super_CordRep).tag = '\0';
  (pCVar3->super_CordRep).storage[0] = '\0';
  (pCVar3->super_CordRep).storage[1] = '\0';
  (pCVar3->super_CordRep).storage[2] = '\0';
  (pCVar3->super_CordRep).refcount.count_.super___atomic_base<int>._M_i = 2;
  uVar1 = AllocatedSizeToTag(sVar2);
  (pCVar3->super_CordRep).tag = uVar1;
  return pCVar3;
}

Assistant:

static CordRepFlat* NewImpl(size_t len, Args... args ABSL_ATTRIBUTE_UNUSED) {
    if (len <= kMinFlatLength) {
      len = kMinFlatLength;
    } else if (len > max_flat_size - kFlatOverhead) {
      len = max_flat_size - kFlatOverhead;
    }

    // Round size up so it matches a size we can exactly express in a tag.
    const size_t size = RoundUpForTag(len + kFlatOverhead);
    void* const raw_rep = ::operator new(size);
    // GCC 13 has a false-positive -Wstringop-overflow warning here.
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic push
    #pragma GCC diagnostic ignored "-Wstringop-overflow"
    #endif
    CordRepFlat* rep = new (raw_rep) CordRepFlat();
    rep->tag = AllocatedSizeToTag(size);
    #if ABSL_INTERNAL_HAVE_MIN_GNUC_VERSION(13, 0)
    #pragma GCC diagnostic pop
    #endif
    return rep;
  }